

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O1

void __thiscall helics::helicsCLI11App::addSystemInfoCall(helicsCLI11App *this)

{
  _Any_data local_78;
  code *local_68;
  code *local_60;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"--system","");
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:152:13)>
             ::_M_invoke;
  local_68 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:152:13)>
             ::_M_manager;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"display system information details","");
  CLI::App::add_flag_callback(&this->super_App,&local_38,(function<void_()> *)&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addSystemInfoCall()
    {
        add_flag_callback(
            "--system",
            []() {
                std::cout << systemInfo() << std::endl;
                throw CLI::Success{};
            },
            "display system information details");
    }